

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QTransform>::moveAppend
          (QGenericArrayOps<QTransform> *this,QTransform *b,QTransform *e)

{
  qsizetype *pqVar1;
  QTransform *pQVar2;
  long lVar3;
  qreal *pqVar4;
  qreal *pqVar5;
  
  if (b != e) {
    pQVar2 = (this->super_QArrayDataPointer<QTransform>).ptr;
    for (; b < e; b = (QTransform *)((long)b + 0x50)) {
      pqVar4 = (qreal *)b;
      pqVar5 = (qreal *)(pQVar2 + (this->super_QArrayDataPointer<QTransform>).size);
      for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
        *pqVar5 = *pqVar4;
        pqVar4 = pqVar4 + 1;
        pqVar5 = pqVar5 + 1;
      }
      pqVar1 = &(this->super_QArrayDataPointer<QTransform>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }